

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O3

int tclpkcs11_sign(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  _func_char_ptr_uint *p_Var2;
  tclpkcs11_handle *handle;
  Tcl_Obj *pTVar3;
  Tcl_Obj *pTVar4;
  Tcl_Obj *pTVar5;
  int iVar6;
  int iVar7;
  uchar *outbuf;
  unsigned_long uVar8;
  long *plVar9;
  Tcl_Obj *pTVar10;
  Tcl_Obj *pTVar11;
  uchar *outbuf_00;
  ProcErrorProc *pPVar12;
  long lVar13;
  char *pcVar14;
  CK_RV CVar15;
  CK_MECHANISM *pCVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int tcl_keylist_llength;
  CK_ULONG resultbuf_len;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG foundObjs;
  long slotid_long;
  Tcl_Obj **tcl_keylist_values;
  CK_MECHANISM mechanism_desc_512;
  CK_MECHANISM mechanism_desc;
  CK_OBJECT_CLASS objectclass_pk;
  CK_ATTRIBUTE template [2];
  uchar resultbuf [1024];
  uint local_504;
  Tcl_Obj *local_500;
  Tcl_Obj *local_4f8;
  Tcl_Obj *local_4f0;
  CK_ULONG local_4e8;
  CK_MECHANISM *local_4e0;
  unsigned_long local_4d8;
  CK_OBJECT_HANDLE local_4d0;
  ClientData local_4c8;
  CK_ULONG local_4c0;
  CK_SLOT_ID local_4b8;
  Tcl_Obj **local_4b0;
  CK_MECHANISM local_4a8;
  CK_MECHANISM local_488;
  undefined8 local_470;
  CK_ATTRIBUTE local_468;
  undefined8 uStack_450;
  undefined8 *local_448;
  undefined8 uStack_440;
  CK_BYTE local_438 [1032];
  
  local_488.ulParameterLen = 0;
  local_488.mechanism = 0x1201;
  local_488.pParameter = (CK_VOID_PTR)0x0;
  local_4a8.ulParameterLen = 0;
  local_4a8.mechanism = 0xd4321006;
  local_4a8.pParameter = (CK_VOID_PTR)0x0;
  local_468.pValue = (uchar *)0x0;
  local_448 = (undefined8 *)0x0;
  uStack_440 = 0;
  local_468.ulValueLen = 0;
  uStack_450 = 0;
  local_468.type = 0x102;
  pTVar11 = objv[1];
  pTVar1 = objv[2];
  pTVar10 = objv[3];
  p_Var2 = tclStubsPtr->tcl_Alloc;
  local_4c8 = cd;
  iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  outbuf = (uchar *)(*p_Var2)(iVar6 / 2);
  iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
  uVar8 = tclpkcs11_string_to_bytearray(pTVar1,outbuf,(long)(iVar6 / 2));
  plVar9 = (long *)(*tclStubsPtr->tcl_GetString)(pTVar11);
  auVar17[0] = -((char)*plVar9 == 'C');
  auVar17[1] = -(*(char *)((long)plVar9 + 1) == 'K');
  auVar17[2] = -(*(char *)((long)plVar9 + 2) == 'M');
  auVar17[3] = -(*(char *)((long)plVar9 + 3) == '_');
  auVar17[4] = -(*(char *)((long)plVar9 + 4) == 'G');
  auVar17[5] = -(*(char *)((long)plVar9 + 5) == 'O');
  auVar17[6] = -(*(char *)((long)plVar9 + 6) == 'S');
  auVar17[7] = -(*(char *)((long)plVar9 + 7) == 'T');
  auVar17[8] = -((char)plVar9[1] == 'R');
  auVar17[9] = -(*(char *)((long)plVar9 + 9) == '3');
  auVar17[10] = -(*(char *)((long)plVar9 + 10) == '4');
  auVar17[0xb] = -(*(char *)((long)plVar9 + 0xb) == '1');
  auVar17[0xc] = -(*(char *)((long)plVar9 + 0xc) == '0');
  auVar17[0xd] = -(*(char *)((long)plVar9 + 0xd) == '_');
  auVar17[0xe] = -(*(char *)((long)plVar9 + 0xe) == '5');
  auVar17[0xf] = -(*(char *)((long)plVar9 + 0xf) == '1');
  auVar18[0] = -((char)plVar9[2] == '2');
  auVar18[1] = 0xff;
  auVar18[2] = 0xff;
  auVar18[3] = 0xff;
  auVar18[4] = 0xff;
  auVar18[5] = 0xff;
  auVar18[6] = 0xff;
  auVar18[7] = 0xff;
  auVar18[8] = 0xff;
  auVar18[9] = 0xff;
  auVar18[10] = 0xff;
  auVar18[0xb] = 0xff;
  auVar18[0xc] = 0xff;
  auVar18[0xd] = 0xff;
  auVar18[0xe] = 0xff;
  auVar18[0xf] = 0xff;
  auVar18 = auVar18 & auVar17;
  if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
    local_4e8 = 0x80;
    if ((int)uVar8 == 0x40) {
      pCVar16 = &local_4a8;
LAB_001061d3:
      if (1 < pTVar10->refCount) {
        pTVar10 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar10);
      }
      iVar6 = (*tclStubsPtr->tcl_ListObjGetElements)
                        ((Tcl_Interp_conflict *)interp,pTVar10,(int *)&local_504,&local_4b0);
      if (iVar6 != 0) {
        return iVar6;
      }
      if ((local_504 & 1) == 0) {
        if (0 < (int)local_504) {
          lVar13 = 0;
          local_4f0 = (Tcl_Obj *)0x0;
          local_4f8 = (Tcl_Obj *)0x0;
          local_500 = (Tcl_Obj *)0x0;
          pTVar11 = (Tcl_Obj *)0x0;
          local_4e0 = pCVar16;
          local_4d8 = uVar8;
          do {
            pTVar1 = local_4b0[lVar13];
            pTVar10 = local_4b0[lVar13 + 1];
            pcVar14 = (*tclStubsPtr->tcl_GetString)(pTVar1);
            iVar6 = strcmp(pcVar14,"pkcs11_handle");
            pTVar3 = local_500;
            pTVar4 = local_4f8;
            pTVar5 = pTVar10;
            if (iVar6 != 0) {
              pcVar14 = (*tclStubsPtr->tcl_GetString)(pTVar1);
              iVar6 = strcmp(pcVar14,"pkcs11_slotid");
              pTVar3 = local_500;
              pTVar4 = pTVar10;
              pTVar5 = local_4f0;
              if (iVar6 != 0) {
                pcVar14 = (*tclStubsPtr->tcl_GetString)(pTVar1);
                iVar6 = strcmp(pcVar14,"pkcs11_id");
                pTVar3 = pTVar10;
                pTVar4 = local_4f8;
                pTVar5 = local_4f0;
                if (iVar6 != 0) {
                  pcVar14 = (*tclStubsPtr->tcl_GetString)(pTVar1);
                  iVar6 = strcmp(pcVar14,"hobj_privkey");
                  pTVar3 = local_500;
                  pTVar4 = local_4f8;
                  pTVar5 = local_4f0;
                  if (iVar6 == 0) {
                    pTVar11 = pTVar10;
                  }
                }
              }
            }
            local_4f0 = pTVar5;
            local_4f8 = pTVar4;
            local_500 = pTVar3;
            pCVar16 = local_4e0;
            lVar13 = lVar13 + 2;
          } while ((int)lVar13 < (int)local_504);
          iVar6 = (int)local_4d8;
          if (local_4f0 != (Tcl_Obj *)0x0) {
            if (local_4f8 == (Tcl_Obj *)0x0) {
              pPVar12 = tclStubsPtr->tcl_SetObjResult;
              pcVar14 = "could not find element named \"pkcs11_slotid\" in keylist";
            }
            else if (local_500 == (Tcl_Obj *)0x0 && pTVar11 == (Tcl_Obj *)0x0) {
              pPVar12 = tclStubsPtr->tcl_SetObjResult;
              pcVar14 = "could not find element named \"pkcs11_id or hobj_privkey\" in keylist";
            }
            else {
              lVar13 = (**(code **)((long)local_4c8 + 0x40))(local_4c8,local_4f0);
              if (lVar13 != 0) {
                handle = *(tclpkcs11_handle **)(lVar13 + 0x18);
                if (handle == (tclpkcs11_handle *)0x0) {
                  pPVar12 = tclStubsPtr->tcl_SetObjResult;
                  pcVar14 = "invalid handle";
LAB_00106462:
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar14,-1);
                  goto LAB_001063fc;
                }
                iVar7 = (*tclStubsPtr->tcl_GetLongFromObj)
                                  ((Tcl_Interp_conflict *)interp,local_4f8,(long *)&local_4b8);
                if (iVar7 != 0) {
                  return iVar7;
                }
                iVar7 = tclpkcs11_start_session(handle,local_4b8);
                pTVar1 = local_500;
                if (iVar7 == 0) {
                  if (pTVar11 == (Tcl_Obj *)0x0) {
                    p_Var2 = tclStubsPtr->tcl_Alloc;
                    iVar6 = (*tclStubsPtr->tcl_GetCharLength)(local_500);
                    outbuf_00 = (uchar *)(*p_Var2)(iVar6 / 2);
                    local_468.pValue = outbuf_00;
                    iVar6 = (*tclStubsPtr->tcl_GetCharLength)(pTVar1);
                    local_468.ulValueLen =
                         tclpkcs11_string_to_bytearray(pTVar1,outbuf_00,(long)(iVar6 / 2));
                    local_448 = &local_470;
                    local_470 = 3;
                    uStack_440 = 8;
                    CVar15 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_468,2);
                    if (CVar15 == 0) {
                      CVar15 = (*handle->pkcs11->C_FindObjects)
                                         (handle->session,&local_4d0,1,&local_4c0);
                      if (CVar15 != 0) {
                        pPVar12 = tclStubsPtr->tcl_SetObjResult;
                        pTVar11 = tclpkcs11_pkcs11_error(CVar15);
                        (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar11);
                        (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                        return 1;
                      }
                      (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                      iVar6 = (int)local_4d8;
                      pCVar16 = local_4e0;
                      if (local_4c0 == 0) {
                        pPVar12 = tclStubsPtr->tcl_SetObjResult;
                        pcVar14 = "PKCS11_ERROR MAYBE_LOGIN";
                        goto LAB_00106462;
                      }
                      goto LAB_001064c4;
                    }
                  }
                  else {
                    pcVar14 = (*tclStubsPtr->tcl_GetString)(pTVar11);
                    pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar14 + 4,-1);
                    iVar7 = (*tclStubsPtr->tcl_GetCharLength)(pTVar11);
                    tclpkcs11_string_to_bytearray(pTVar11,(uchar *)&local_4d0,(long)(iVar7 / 2));
LAB_001064c4:
                    CVar15 = (*handle->pkcs11->C_SignInit)(handle->session,pCVar16,local_4d0);
                    if ((CVar15 == 0) &&
                       (CVar15 = (*handle->pkcs11->C_Sign)
                                           (handle->session,outbuf,(long)iVar6,local_438,&local_4e8)
                       , CVar15 == 0)) {
                      pTVar11 = tclpkcs11_bytearray_to_string(local_438,local_4e8);
                      (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar11);
                      return 0;
                    }
                  }
                  pPVar12 = tclStubsPtr->tcl_SetObjResult;
                }
                else {
                  CVar15 = (CK_RV)iVar7;
                  pPVar12 = tclStubsPtr->tcl_SetObjResult;
                }
                pTVar11 = tclpkcs11_pkcs11_error(CVar15);
                goto LAB_001063fc;
              }
              pPVar12 = tclStubsPtr->tcl_SetObjResult;
              pcVar14 = "invalid handle";
            }
            goto LAB_001063ee;
          }
        }
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar14 = "could not find element named \"pkcs11_handle\" in keylist";
      }
      else {
        pPVar12 = tclStubsPtr->tcl_SetObjResult;
        pcVar14 = "list must have an even number of elements";
      }
    }
    else {
      pPVar12 = tclStubsPtr->tcl_SetObjResult;
      pcVar14 = "\"pki::pkcs11::sign CKM_GOSTR3410_512 input\" - bad len hash";
    }
  }
  else if (*(long *)((long)plVar9 + 5) == 0x303134335254534f && *plVar9 == 0x54534f475f4d4b43) {
    local_4e8 = 0x40;
    if ((int)uVar8 == 0x20) {
      pCVar16 = &local_488;
      goto LAB_001061d3;
    }
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar14 = "\"pki::pkcs11::sign CKM_GOSTR3410 input\" - bad len hash";
  }
  else {
    pPVar12 = tclStubsPtr->tcl_SetObjResult;
    pcVar14 = "\"pki::pkcs11::sign CKM_GOSTR3410|CKM_GOSTR3410_512 input\" - bad sign";
  }
LAB_001063ee:
  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)(pcVar14,-1);
LAB_001063fc:
  (*pPVar12)((Tcl_Interp_conflict *)interp,pTVar11);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_sign(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "SIGN START\n");
  return(tclpkcs11_perform_pki_sign(cd, interp, objc, objv));
}